

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3SelectDoctotal(Fts3Table *pTab,sqlite3_stmt **ppStmt)

{
  int i;
  int iVar1;
  sqlite3_stmt *in_RSI;
  long in_FS_OFFSET;
  int rc;
  sqlite3_stmt **unaff_retaddr;
  sqlite3_stmt *pStmt;
  int in_stack_ffffffffffffffd8;
  sqlite3_stmt *pStmt_00;
  sqlite3_value **apVal;
  
  apVal = *(sqlite3_value ***)(in_FS_OFFSET + 0x28);
  pStmt_00 = (sqlite3_stmt *)0x0;
  i = fts3SqlStmt(pTab,ppStmt._4_4_,unaff_retaddr,apVal);
  if (i == 0) {
    sqlite3_bind_int(in_RSI,0,in_stack_ffffffffffffffd8);
    iVar1 = sqlite3_step((sqlite3_stmt *)ppStmt);
    if ((iVar1 != 100) || (iVar1 = sqlite3_column_type(in_RSI,i), iVar1 != 4)) {
      i = sqlite3_reset(pStmt_00);
      if (i == 0) {
        i = 0x10b;
      }
      pStmt_00 = (sqlite3_stmt *)0x0;
    }
  }
  *(sqlite3_stmt **)in_RSI = pStmt_00;
  if (*(sqlite3_value ***)(in_FS_OFFSET + 0x28) != apVal) {
    __stack_chk_fail();
  }
  return i;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3SelectDoctotal(
  Fts3Table *pTab,                /* Fts3 table handle */
  sqlite3_stmt **ppStmt           /* OUT: Statement handle */
){
  sqlite3_stmt *pStmt = 0;
  int rc;
  rc = fts3SqlStmt(pTab, SQL_SELECT_STAT, &pStmt, 0);
  if( rc==SQLITE_OK ){
    sqlite3_bind_int(pStmt, 1, FTS_STAT_DOCTOTAL);
    if( sqlite3_step(pStmt)!=SQLITE_ROW
     || sqlite3_column_type(pStmt, 0)!=SQLITE_BLOB
    ){
      rc = sqlite3_reset(pStmt);
      if( rc==SQLITE_OK ) rc = FTS_CORRUPT_VTAB;
      pStmt = 0;
    }
  }
  *ppStmt = pStmt;
  return rc;
}